

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O0

char * mp_get_hex_internal(mp_int *x,uint8_t letter_offset)

{
  byte bVar1;
  ulong uVar2;
  char *buf;
  char digit;
  uint8_t mask;
  uint8_t digitval;
  size_t nibble_within_word;
  size_t word_idx;
  size_t nibble;
  char *outbuf;
  size_t bufsize;
  size_t nibbles;
  uint8_t letter_offset_local;
  mp_int *x_local;
  
  uVar2 = x->nw * 0x10;
  buf = (char *)safemalloc(uVar2 + 1,1,0);
  buf[uVar2] = '\0';
  for (word_idx = 0; word_idx < uVar2; word_idx = word_idx + 1) {
    bVar1 = (byte)(x->w[word_idx >> 4] >> (sbyte)((word_idx & 0xf) << 2)) & 0xf;
    buf[(uVar2 - 1) - word_idx] = bVar1 + 0x30 + (letter_offset & -(char)((int)(bVar1 + 6) >> 4));
  }
  trim_leading_zeroes(buf,uVar2 + 1,uVar2 - 1);
  return buf;
}

Assistant:

static char *mp_get_hex_internal(mp_int *x, uint8_t letter_offset)
{
    size_t nibbles = x->nw * BIGNUM_INT_BYTES * 2;
    size_t bufsize = nibbles + 1;
    char *outbuf = snewn(bufsize, char);
    outbuf[nibbles] = '\0';

    for (size_t nibble = 0; nibble < nibbles; nibble++) {
        size_t word_idx = nibble / (BIGNUM_INT_BYTES*2);
        size_t nibble_within_word = nibble % (BIGNUM_INT_BYTES*2);
        uint8_t digitval = 0xF & (x->w[word_idx] >> (nibble_within_word * 4));

        uint8_t mask = -((digitval + 6) >> 4);
        char digit = digitval + '0' + (letter_offset & mask);
        outbuf[nibbles-1 - nibble] = digit;
    }

    trim_leading_zeroes(outbuf, bufsize, nibbles - 1);
    return outbuf;
}